

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_2d_scale_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int16_t *piVar9;
  byte bVar10;
  byte bVar11;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  InterpFilterParams *in_stack_00000008;
  int32_t tmp_1;
  int32_t tmp;
  CONV_BUF_TYPE res;
  int k_1;
  int32_t sum_1;
  int16_t *y_filter;
  uint in_stack_00000028;
  int y_filter_idx;
  int16_t *src_y;
  int y_1;
  int y_qn;
  int x_1;
  int offset_bits;
  int16_t *src_vert;
  int k;
  int32_t sum;
  int16_t *x_filter;
  int x_filter_idx;
  uint8_t *src_x;
  int x;
  int x_qn;
  int y;
  uint8_t *src_horiz;
  int bd;
  int fo_horiz;
  int fo_vert;
  int im_stride;
  int bits;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int im_h;
  int16_t im_block [34304];
  int iStack_10cc8;
  int iStack_10cc0;
  int iStack_10cbc;
  int iStack_10ca0;
  uint uStack_10c9c;
  int iStack_10c98;
  undefined2 *puStack_10c90;
  int iStack_10c88;
  int iStack_10c84;
  int iStack_10c64;
  uint uStack_10c60;
  int iStack_10c5c;
  long lStack_10c58;
  undefined2 auStack_10c28 [34324];
  
  uVar1 = _tmp->taps;
  lVar4 = *(long *)(_y_1 + 2);
  iVar3 = _y_1[4];
  bVar10 = ('\x0e' - (char)_y_1[5]) - (char)_y_1[6];
  iVar6 = _tmp->taps / 2 - 1;
  uVar2 = in_stack_00000008->taps;
  lStack_10c58 = in_RDI - iVar6 * in_ESI;
  for (iStack_10c5c = 0;
      iStack_10c5c <
      (int)(((int)((in_R9D + -1) * (int)src_y + in_stack_00000028) >> 10) + (uint)uVar1);
      iStack_10c5c = iStack_10c5c + 1) {
    uStack_10c60 = k_1;
    for (iStack_10c64 = 0; iStack_10c64 < in_R8D; iStack_10c64 = iStack_10c64 + 1) {
      piVar9 = av1_get_interp_filter_subpel_kernel
                         (in_stack_00000008,(int)(uStack_10c60 & 0x3ff) >> 6);
      iStack_10c84 = 0x4000;
      for (iStack_10c88 = 0; iStack_10c88 < (int)(uint)in_stack_00000008->taps;
          iStack_10c88 = iStack_10c88 + 1) {
        iStack_10c84 = (int)piVar9[iStack_10c88] *
                       (uint)*(byte *)(lStack_10c58 + ((int)uStack_10c60 >> 10) +
                                      (long)(int)(iStack_10c88 - (uVar2 / 2 - 1))) + iStack_10c84;
      }
      auStack_10c28[iStack_10c5c * in_R8D + iStack_10c64] =
           (short)(iStack_10c84 + ((1 << ((byte)_y_1[5] & 0x1f)) >> 1) >> ((byte)_y_1[5] & 0x1f));
      uStack_10c60 = (int)y_filter + uStack_10c60;
    }
    lStack_10c58 = lStack_10c58 + in_ESI;
  }
  puStack_10c90 = auStack_10c28 + iVar6 * in_R8D;
  bVar11 = 0x16 - (char)_y_1[5];
  for (iStack_10c98 = 0; iStack_10c98 < in_R8D; iStack_10c98 = iStack_10c98 + 1) {
    uStack_10c9c = in_stack_00000028;
    for (iStack_10ca0 = 0; iStack_10ca0 < in_R9D; iStack_10ca0 = iStack_10ca0 + 1) {
      piVar9 = av1_get_interp_filter_subpel_kernel(_tmp,(int)(uStack_10c9c & 0x3ff) >> 6);
      iStack_10cbc = 1 << (bVar11 & 0x1f);
      for (iStack_10cc0 = 0; iStack_10cc0 < (int)(uint)_tmp->taps; iStack_10cc0 = iStack_10cc0 + 1)
      {
        iStack_10cbc = (int)piVar9[iStack_10cc0] *
                       (int)(short)puStack_10c90
                                   [(long)(((int)uStack_10c9c >> 10) * in_R8D) +
                                    (long)((iStack_10cc0 - iVar6) * in_R8D)] + iStack_10cbc;
      }
      uVar7 = iStack_10cbc + ((1 << ((byte)_y_1[6] & 0x1f)) >> 1) >> ((byte)_y_1[6] & 0x1f);
      if (_y_1[8] == 0) {
        uVar5 = clip_pixel((int)(((uVar7 & 0xffff) -
                                 ((1 << (bVar11 - (char)_y_1[6] & 0x1f)) +
                                 (1 << ((bVar11 - (char)_y_1[6]) - 1 & 0x1f)))) +
                                ((1 << (bVar10 & 0x1f)) >> 1)) >> (bVar10 & 0x1f));
        *(uint8_t *)(in_RDX + (iStack_10ca0 * in_ECX + iStack_10c98)) = uVar5;
      }
      else if (*_y_1 == 0) {
        *(short *)(lVar4 + (long)(iStack_10ca0 * iVar3 + iStack_10c98) * 2) = (short)uVar7;
      }
      else {
        uVar8 = (uint)*(ushort *)(lVar4 + (long)(iStack_10ca0 * iVar3 + iStack_10c98) * 2);
        if (_y_1[9] == 0) {
          iStack_10cc8 = (int)((uVar7 & 0xffff) + uVar8) >> 1;
        }
        else {
          iStack_10cc8 = (int)(uVar8 * _y_1[10] + (uVar7 & 0xffff) * _y_1[0xb]) >> 4;
        }
        uVar5 = clip_pixel((iStack_10cc8 -
                           ((1 << (bVar11 - (char)_y_1[6] & 0x1f)) +
                           (1 << ((bVar11 - (char)_y_1[6]) - 1 & 0x1f)))) +
                           ((1 << (bVar10 & 0x1f)) >> 1) >> (bVar10 & 0x1f));
        *(uint8_t *)(in_RDX + (iStack_10ca0 * in_ECX + iStack_10c98)) = uVar5;
      }
      uStack_10c9c = (int)src_y + uStack_10c9c;
    }
    puStack_10c90 = puStack_10c90 + 1;
  }
  return;
}

Assistant:

void av1_convolve_2d_scale_c(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const InterpFilterParams *filter_params_x,
                             const InterpFilterParams *filter_params_y,
                             const int subpel_x_qn, const int x_step_qn,
                             const int subpel_y_qn, const int y_step_qn,
                             ConvolveParams *conv_params) {
  int16_t im_block[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  for (int y = 0; y < im_h; ++y) {
    int x_qn = subpel_x_qn;
    for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
      const uint8_t *const src_x = &src_horiz[(x_qn >> SCALE_SUBPEL_BITS)];
      const int x_filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(x_filter_idx < SUBPEL_SHIFTS);
      const int16_t *x_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_x, x_filter_idx);
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_x[k - fo_horiz];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
    src_horiz += src_stride;
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int x = 0; x < w; ++x) {
    int y_qn = subpel_y_qn;
    for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
      const int16_t *src_y = &src_vert[(y_qn >> SCALE_SUBPEL_BITS) * im_stride];
      const int y_filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(y_filter_idx < SUBPEL_SHIFTS);
      const int16_t *y_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_y, y_filter_idx);
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_y[(k - fo_vert) * im_stride];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
      }
    }
    src_vert++;
  }
}